

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O3

void __thiscall
soplex::SPxSolverBase<double>::changeUpper
          (SPxSolverBase<double> *this,VectorBase<double> *newUpper,bool scale)

{
  ulong uVar1;
  
  this->m_nonbasicValue = 0.0;
  this->m_nonbasicValueUpToDate = false;
  SPxLPBase<double>::changeUpper(&this->super_SPxLPBase<double>,newUpper,scale);
  if (NO_PROBLEM < (this->super_SPxBasisBase<double>).thestatus) {
    if (0 < (int)((ulong)((long)(newUpper->val).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(newUpper->val).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3)) {
      uVar1 = 0;
      do {
        (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6a])
                  ((this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar1],0,this,uVar1 & 0xffffffff);
        uVar1 = uVar1 + 1;
      } while ((long)uVar1 <
               (long)(int)((ulong)((long)(newUpper->val).
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish -
                                  (long)(newUpper->val).
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 3));
    }
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])(this);
    return;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeUpper(const VectorBase<R>& newUpper, bool scale)
{
   // we better recompute the nonbasic value when changing all upper bounds
   forceRecompNonbasicValue();

   SPxLPBase<R>::changeUpper(newUpper, scale);

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
   {
      for(int i = 0; i < newUpper.dim(); ++i)
         changeUpperStatus(i, this->upper(i));

      unInit();
   }
}